

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O1

void google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased
               (int field_number,string *value,CodedOutputStream *output)

{
  bool bVar1;
  uint uVar2;
  uint8_t *puVar3;
  Nonnull<const_char_*> pcVar4;
  ulong uVar5;
  byte *pbVar6;
  uint uVar7;
  
  pbVar6 = output->cur_;
  if ((output->impl_).end_ <= pbVar6) {
    pbVar6 = io::EpsCopyOutputStream::EnsureSpaceFallback(&output->impl_,pbVar6);
  }
  uVar5 = (ulong)(field_number * 8 + 2);
  output->cur_ = pbVar6;
  if (0x7f < (uint)(field_number << 3)) {
    do {
      uVar2 = (uint)uVar5;
      *pbVar6 = (byte)uVar5 | 0x80;
      uVar5 = uVar5 >> 7;
      pbVar6 = pbVar6 + 1;
    } while (0x3fff < uVar2);
  }
  *pbVar6 = (byte)uVar5;
  output->cur_ = pbVar6 + 1;
  if ((value->_M_string_length & 0xffffffff80000000) == 0) {
    pcVar4 = (Nonnull<const_char_*>)0x0;
  }
  else {
    pcVar4 = absl::lts_20250127::log_internal::MakeCheckOpString<unsigned_long,unsigned_long>
                       (value->_M_string_length,0x7fffffff,"value.size() <= kInt32MaxSize");
  }
  if (pcVar4 != (Nonnull<const_char_*>)0x0) {
    WriteStringMaybeAliased();
  }
  uVar2 = (uint)value->_M_string_length;
  pbVar6 = output->cur_;
  if ((output->impl_).end_ <= pbVar6) {
    pbVar6 = io::EpsCopyOutputStream::EnsureSpaceFallback(&output->impl_,pbVar6);
  }
  output->cur_ = pbVar6;
  uVar7 = uVar2;
  if (0x7f < uVar2) {
    do {
      *pbVar6 = (byte)uVar7 | 0x80;
      uVar2 = uVar7 >> 7;
      pbVar6 = pbVar6 + 1;
      bVar1 = 0x3fff < uVar7;
      uVar7 = uVar2;
    } while (bVar1);
  }
  *pbVar6 = (byte)uVar2;
  output->cur_ = pbVar6 + 1;
  puVar3 = io::EpsCopyOutputStream::WriteRawMaybeAliased
                     (&output->impl_,(value->_M_dataplus)._M_p,(int)value->_M_string_length,
                      pbVar6 + 1);
  output->cur_ = puVar3;
  return;
}

Assistant:

void WireFormatLite::WriteStringMaybeAliased(int field_number,
                                             const std::string& value,
                                             io::CodedOutputStream* output) {
  // String is for UTF-8 text only
  WriteTag(field_number, WIRETYPE_LENGTH_DELIMITED, output);
  ABSL_CHECK_LE(value.size(), kInt32MaxSize);
  output->WriteVarint32(value.size());
  output->WriteRawMaybeAliased(value.data(), value.size());
}